

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

int execmd_recurs(voccxdef *ctx,objnum actor,objnum verb,objnum dobj,objnum prep,objnum iobj,
                 int validate_dobj,int validate_iobj)

{
  runsdef *prVar1;
  runsdef *prVar2;
  int iVar3;
  int iVar4;
  undefined6 in_register_0000000a;
  vocoldef *iobjv_00;
  uchar *tpl_00;
  vocoldef *dobjv_00;
  objnum prep_local;
  int newstyle;
  uchar tpl [16];
  vocoldef dobjv;
  vocoldef iobjv;
  voccxdef ctx_copy;
  
  prVar1 = ctx->voccxrun->runcxsp;
  prVar2 = ctx->voccxrun->runcxbp;
  prep_local = prep;
  memcpy(&ctx_copy,ctx,0x11c0);
  ctx_copy.voccxunknown = 0;
  if ((int)CONCAT62(in_register_0000000a,dobj) != 0xffff) {
    dobjv.vocollst = "";
    dobjv.vocolfst = "";
    dobjv.vocolflg = 0;
    dobjv.vocolobj = dobj;
  }
  if (iobj != 0xffff) {
    iobjv.vocollst = "";
    iobjv.vocolfst = "";
    iobjv.vocolflg = 0;
    iobjv.vocolobj = iobj;
  }
  if (dobj == 0xffff) {
    exe_get_tpl(&ctx_copy,verb,(uint *)&newstyle,(uint *)tpl);
    if (tpl._0_4_ == 0) goto LAB_001f009e;
    iobjv_00 = (vocoldef *)0x0;
    iVar3 = 0;
    dobjv_00 = (vocoldef *)0x0;
    newstyle = 0;
    tpl_00 = (uchar *)0x0;
  }
  else {
    if (iobj == 0xffff) {
      iVar3 = voctplfnd(&ctx_copy,verb,0xffff,tpl,&newstyle);
      if (iVar3 == 0) goto LAB_001f009e;
      iobjv_00 = (vocoldef *)0x0;
    }
    else {
      iVar3 = voctplfnd(&ctx_copy,verb,prep,tpl,&newstyle);
      if (iVar3 == 0) {
LAB_001f009e:
        iVar3 = 0x4b0;
        goto LAB_001f00a3;
      }
      iobjv_00 = &iobjv;
    }
    tpl_00 = tpl;
    dobjv_00 = &dobjv;
    iVar3 = 1;
  }
  iVar3 = exe1cmd(&ctx_copy,actor,verb,dobjv_00,&prep_local,iobjv_00,0,tpl_00,newstyle,1,
                  validate_dobj,validate_iobj,dobjv_00,0,iVar3,0,0);
LAB_001f00a3:
  iVar4 = 0x3f5;
  if (iVar3 != 0x419) {
    iVar4 = iVar3;
  }
  (ctx_copy.voccxrun)->runcxsp = prVar1;
  (ctx_copy.voccxrun)->runcxbp = prVar2;
  return iVar4;
}

Assistant:

int execmd_recurs(voccxdef *ctx, objnum actor, objnum verb,
                  objnum dobj, objnum prep, objnum iobj,
                  int validate_dobj, int validate_iobj)
{
    int       err;
    int       newstyle;
    uchar     tpl[VOCTPL2SIZ];
    vocoldef  dobjv;
    vocoldef  iobjv;
    voccxdef  ctx_copy;
    runsdef *orig_sp;
    runsdef *orig_bp;

    /*
     *   Save the stack and base pointers as they are on entry.  Since
     *   exe1cmd() is being called recursively, it won't automatically clear
     *   the stack after it's done as it would at the top level; this means
     *   that an aborted frame can be left on the stack if we throw an
     *   'exit' or 'abort' in the course of executing the command.  To make
     *   sure we don't leave any aborted frames on the stack before
     *   returning to our caller, we simply need to restore the stack and
     *   frame pointers on the way out as they were on the way in.  
     */
    orig_sp = ctx->voccxrun->runcxsp;
    orig_bp = ctx->voccxrun->runcxbp;

    /* make a copy of the voc context, so that changes aren't permanent */
    ctx_copy = *ctx;
    ctx = &ctx_copy;

    /* 
     *   there are no unknown words in the recursive command, since the
     *   command was prepared directly from resolved objects 
     */
    ctx->voccxunknown = 0;

    /* set up the vocoldef structure for the direct object, if present */
    if (dobj != MCMONINV)
    {
        dobjv.vocolobj = dobj;
        dobjv.vocolfst = dobjv.vocollst = "";
        dobjv.vocolflg = 0;
    }

    /* set up the vocoldef structure for the indirect object, if present */
    if (iobj != MCMONINV)
    {
        iobjv.vocolobj = iobj;
        iobjv.vocolfst = iobjv.vocollst = "";
        iobjv.vocolflg = 0;
    }
    
    /* figure out which template we need, based on the objects provided */
    if (dobj == MCMONINV)
    {
        uint actofs;
        uint tplofs;
        
        /* 
         *   No objects were provided - use the verb's "action" method.
         *   Make sure that there is in fact an "action" method. 
         */
        exe_get_tpl(ctx, verb, &tplofs, &actofs);
        if (actofs != 0)
        {
            /* execute the "action" method */
            err = exe1cmd(ctx, actor, verb, 0, &prep, 0, FALSE,
                          0, FALSE, TRUE, validate_dobj, validate_iobj,
                          0, 0, 0, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }
    else if (iobj == MCMONINV)
    {
        /* 
         *   No indirect object was provided, but a direct object is
         *   present - use the one-object template.  First, look up the
         *   template.  
         */
        if (voctplfnd(ctx, verb, MCMONINV, tpl, &newstyle))
        {
            /* execute the command */
            err = exe1cmd(ctx, actor, verb, &dobjv, &prep, 0, FALSE,
                          tpl, newstyle, TRUE, validate_dobj, validate_iobj,
                          &dobjv, 0, 1, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }
    else
    {
        /* 
         *   Both a direct and indirect object were provided - find the
         *   two-object template for the given preposition.
         */
        if (voctplfnd(ctx, verb, prep, tpl, &newstyle))
        {
            /* execute the command */
            err = exe1cmd(ctx, actor, verb, &dobjv, &prep, &iobjv, FALSE,
                          tpl, newstyle, TRUE, validate_dobj, validate_iobj,
                          &dobjv, 0, 1, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }

    /* 
     *   if the error was EXITPRECMD, change it to EXIT - EXITPRECMD is a
     *   special flag indicating that we exited from a preCommand
     *   function, which is different than normal exiting internally but
     *   not to the game 
     */
    if (err == ERR_RUNEXITPRECMD)
        err = ERR_RUNEXIT;

    /*
     *   restore the original stack and base pointers, to ensure that we
     *   don't leave any aborted frames on the stack 
     */
    ctx->voccxrun->runcxsp = orig_sp;
    ctx->voccxrun->runcxbp = orig_bp;

    /* return the result code */
    return err;
}